

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O3

void tif_5uto32s(OPJ_BYTE *pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ulong uVar6;
  uint uVar7;
  
  uVar6 = 0;
  if ((length & 0xfffffffffffffff8) != 0) {
    do {
      bVar1 = *pSrc;
      bVar2 = pSrc[1];
      bVar3 = pSrc[2];
      bVar4 = pSrc[3];
      bVar5 = pSrc[4];
      pSrc = pSrc + 5;
      pDst[uVar6] = (uint)(bVar1 >> 3);
      pDst[uVar6 + 1] = (uint)(bVar2 >> 6) + (bVar1 & 7) * 4;
      pDst[uVar6 + 2] = bVar2 >> 1 & 0x1f;
      pDst[uVar6 + 3] = (uint)(bVar3 >> 4) | (bVar2 & 1) << 4;
      pDst[uVar6 + 4] = (uint)(bVar4 >> 7) + (bVar3 & 0xf) * 2;
      pDst[uVar6 + 5] = bVar4 >> 2 & 0x1f;
      pDst[uVar6 + 6] = (uint)(bVar5 >> 5) + (bVar4 & 3) * 8;
      pDst[uVar6 + 7] = bVar5 & 0x1f;
      uVar6 = uVar6 + 8;
    } while (uVar6 < (length & 0xfffffffffffffff8));
  }
  if ((length & 7) != 0) {
    bVar1 = *pSrc;
    pDst[uVar6] = (uint)(bVar1 >> 3);
    uVar7 = (uint)(length & 7);
    if (uVar7 != 1) {
      bVar2 = pSrc[1];
      pDst[uVar6 + 1] = (uint)(bVar2 >> 6) + (bVar1 & 7) * 4;
      if ((2 < uVar7) && (pDst[uVar6 + 2] = bVar2 >> 1 & 0x1f, uVar7 != 3)) {
        bVar1 = pSrc[2];
        pDst[uVar6 + 3] = (uint)(bVar1 >> 4) | (bVar2 & 1) << 4;
        if (4 < uVar7) {
          bVar2 = pSrc[3];
          pDst[uVar6 + 4] = (uint)(bVar2 >> 7) + (bVar1 & 0xf) * 2;
          if ((uVar7 != 5) && (pDst[uVar6 + 5] = bVar2 >> 2 & 0x1f, uVar7 == 7)) {
            pDst[uVar6 + 6] = (uint)(pSrc[4] >> 5) + (bVar2 & 3) * 8;
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void tif_5uto32s(const OPJ_BYTE* pSrc, OPJ_INT32* pDst,
                        OPJ_SIZE_T length)
{
    OPJ_SIZE_T i;
    for (i = 0; i < (length & ~(OPJ_SIZE_T)7U); i += 8U) {
        OPJ_UINT32 val0 = *pSrc++;
        OPJ_UINT32 val1 = *pSrc++;
        OPJ_UINT32 val2 = *pSrc++;
        OPJ_UINT32 val3 = *pSrc++;
        OPJ_UINT32 val4 = *pSrc++;

        pDst[i + 0] = (OPJ_INT32)((val0 >> 3));
        pDst[i + 1] = (OPJ_INT32)(((val0 & 0x7U) << 2) | (val1 >> 6));
        pDst[i + 2] = (OPJ_INT32)(((val1 & 0x3FU) >> 1));
        pDst[i + 3] = (OPJ_INT32)(((val1 & 0x1U) << 4) | (val2 >> 4));
        pDst[i + 4] = (OPJ_INT32)(((val2 & 0xFU) << 1) | (val3 >> 7));
        pDst[i + 5] = (OPJ_INT32)(((val3 & 0x7FU) >> 2));
        pDst[i + 6] = (OPJ_INT32)(((val3 & 0x3U) << 3) | (val4 >> 5));
        pDst[i + 7] = (OPJ_INT32)(((val4 & 0x1FU)));

    }
    if (length & 7U) {
        unsigned int val;
        int available = 0;

        length = length & 7U;

        GETBITS(pDst[i + 0], 5)

        if (length > 1U) {
            GETBITS(pDst[i + 1], 5)
            if (length > 2U) {
                GETBITS(pDst[i + 2], 5)
                if (length > 3U) {
                    GETBITS(pDst[i + 3], 5)
                    if (length > 4U) {
                        GETBITS(pDst[i + 4], 5)
                        if (length > 5U) {
                            GETBITS(pDst[i + 5], 5)
                            if (length > 6U) {
                                GETBITS(pDst[i + 6], 5)
                            }
                        }
                    }
                }
            }
        }
    }
}